

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int quicly_retry_calc_cidpair_hash
              (ptls_hash_algorithm_t *sha256,ptls_iovec_t client_cid,ptls_iovec_t server_cid,
              uint64_t *value)

{
  uint64_t uVar1;
  void *in_RCX;
  size_t in_RDX;
  uint8_t *__dest;
  void *in_RSI;
  size_t in_R8;
  uint64_t *in_R9;
  int ret;
  uint8_t *p;
  uint8_t buf [42];
  uint8_t digest [32];
  uint8_t *__dest_00;
  undefined1 uVar2;
  void *in_stack_ffffffffffffff78;
  void *in_stack_ffffffffffffff80;
  ptls_hash_algorithm_t *in_stack_ffffffffffffff88;
  int local_4;
  
  __dest_00 = &stack0xffffffffffffff79;
  uVar2 = (char)in_RDX;
  memcpy(__dest_00,in_RSI,in_RDX);
  __dest = __dest_00 + in_RDX + 1;
  __dest_00[in_RDX] = (uint8_t)in_R8;
  memcpy(__dest,in_RCX,in_R8);
  local_4 = ptls_calc_hash(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                           in_stack_ffffffffffffff78,(size_t)(__dest + in_R8));
  if (local_4 == 0) {
    uVar1 = quicly_decode64((uint8_t **)&stack0xffffffffffffff70);
    *in_R9 = uVar1;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int quicly_retry_calc_cidpair_hash(ptls_hash_algorithm_t *sha256, ptls_iovec_t client_cid, ptls_iovec_t server_cid, uint64_t *value)
{
    uint8_t digest[PTLS_SHA256_DIGEST_SIZE], buf[(QUICLY_MAX_CID_LEN_V1 + 1) * 2], *p = buf;
    int ret;

    *p++ = (uint8_t)client_cid.len;
    memcpy(p, client_cid.base, client_cid.len);
    p += client_cid.len;
    *p++ = (uint8_t)server_cid.len;
    memcpy(p, server_cid.base, server_cid.len);
    p += server_cid.len;

    if ((ret = ptls_calc_hash(sha256, digest, buf, p - buf)) != 0)
        return ret;
    p = digest;
    *value = quicly_decode64((void *)&p);

    return 0;
}